

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O1

int LuaError(lua_State *L)

{
  char *pcVar1;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = (*lua_tolstring)(L,1,(size_t *)0x0);
  std::__cxx11::string::string((string *)&local_50,pcVar1,(allocator *)&local_30);
  std::operator+(&local_30,"[Emmy]",&local_50);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  lua_getglobal(L,"error");
  (*lua_pushstring)(L,local_50._M_dataplus._M_p);
  lua_call(L,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int LuaError(lua_State *L) {
	std::string msg = lua_tostring(L, 1);
	msg = "[Emmy]" + msg;
	lua_getglobal(L, "error");
	lua_pushstring(L, msg.c_str());
	lua_call(L, 1, 0);
	return 0;
}